

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Overlay_Window.cxx
# Opt level: O1

void __thiscall Fl_Overlay_Window::flush(Fl_Overlay_Window *this)

{
  byte bVar1;
  Fl_Overlay_Window *pFVar2;
  
  bVar1 = (this->super_Fl_Double_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.damage_;
  pFVar2 = (Fl_Overlay_Window *)this->overlay_;
  (this->super_Fl_Double_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.damage_ =
       bVar1 & 0xf7;
  Fl_Double_Window::flush(&this->super_Fl_Double_Window,(uint)(pFVar2 == this | bVar1 & 8));
  if ((Fl_Overlay_Window *)this->overlay_ != this) {
    return;
  }
  (*(this->super_Fl_Double_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget
    [0xb])(this);
  return;
}

Assistant:

void Fl_Overlay_Window::flush() {
#ifdef BOXX_BUGS
  if (overlay_ && overlay_ != this && overlay_->shown()) {
    // all drawing to windows hidden by overlay windows is ignored, fix this
    XUnmapWindow(fl_display, fl_xid(overlay_));
    Fl_Double_Window::flush(0);
    XMapWindow(fl_display, fl_xid(overlay_));
    return;
  }
#endif
  int erase_overlay = (damage()&FL_DAMAGE_OVERLAY) | (overlay_ == this);
  clear_damage((uchar)(damage()&~FL_DAMAGE_OVERLAY));
  Fl_Double_Window::flush(erase_overlay);
  if (overlay_ == this) draw_overlay();
}